

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_file_sink-inl.h
# Opt level: O0

string * spdlog::sinks::rotating_file_sink<spdlog::details::null_mutex>::calc_filename
                   (filename_t *filename,size_t index)

{
  long in_RDX;
  string *in_RSI;
  string *in_RDI;
  filename_t ext;
  undefined1 in_stack_000000a0 [16];
  filename_t basename;
  string_view in_stack_000000b0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_format_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  unsigned_long *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_format_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_170 [4];
  string local_130 [32];
  string local_110 [24];
  filename_t *in_stack_ffffffffffffff08;
  undefined1 local_f0 [24];
  undefined1 local_d8 [56];
  undefined8 local_a0;
  undefined1 *local_98;
  string *local_80;
  undefined1 *local_78;
  string *local_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  undefined8 *local_8;
  
  if (in_RDX == 0) {
    std::__cxx11::string::string(in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::string(local_110);
    std::__cxx11::string::string(local_130);
    details::file_helper::split_by_extension(in_stack_ffffffffffffff08);
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xfffffffffffffe70;
    std::tie<std::__cxx11::string,std::__cxx11::string>(in_stack_fffffffffffffe48,__args_1);
    this = local_170;
    std::tuple<std::__cxx11::string&,std::__cxx11::string&>::operator=
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)__args_1,in_stack_fffffffffffffe38);
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1a8869);
    ::fmt::v8::
    basic_format_string<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::basic_format_string<char[8],_0>(this,(char (*) [8])__args_1);
    local_70 = local_110;
    local_78 = local_f0;
    local_80 = local_130;
    local_50 = local_68;
    ::fmt::v8::
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,std::__cxx11::string,unsigned_long,std::__cxx11::string>
              (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    local_28 = &local_a0;
    local_30 = local_d8;
    local_10 = 0xd4d;
    local_a0 = 0xd4d;
    local_20 = local_30;
    local_18 = local_30;
    local_8 = local_28;
    local_98 = local_30;
    ::fmt::v8::vformat_abi_cxx11_(in_stack_000000b0,(format_args)in_stack_000000a0);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_110);
  }
  return in_RDI;
}

Assistant:

SPDLOG_INLINE filename_t rotating_file_sink<Mutex>::calc_filename(const filename_t &filename, std::size_t index)
{
    if (index == 0u)
    {
        return filename;
    }

    filename_t basename, ext;
    std::tie(basename, ext) = details::file_helper::split_by_extension(filename);
    return fmt::format(SPDLOG_FILENAME_T("{}.{}{}"), basename, index, ext);
}